

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *create_info,
          ScratchAllocator *alloc)

{
  VkDescriptorSetLayoutBindingFlagsCreateInfo *pVVar1;
  uint *puVar2;
  
  pVVar1 = copy<VkDescriptorSetLayoutBindingFlagsCreateInfo>(this,create_info,1,alloc);
  if (pVVar1->pBindingFlags != (VkDescriptorBindingFlags *)0x0) {
    puVar2 = copy<unsigned_int>(this,create_info->pBindingFlags,(ulong)create_info->bindingCount,
                                alloc);
    pVVar1->pBindingFlags = puVar2;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pBindingFlags)
		info->pBindingFlags = copy(create_info->pBindingFlags, create_info->bindingCount, alloc);
	return info;
}